

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O1

xmlChar * xmlTextReaderGetAttributeNs
                    (xmlTextReaderPtr reader,xmlChar *localName,xmlChar *namespaceURI)

{
  int iVar1;
  int iVar2;
  xmlChar *pxVar3;
  xmlNs *pxVar4;
  
  if ((((localName != (xmlChar *)0x0 && reader != (xmlTextReaderPtr)0x0) &&
       (reader->node != (xmlNodePtr)0x0)) && (reader->curnode == (xmlNodePtr)0x0)) &&
     (reader->node->type == XML_ELEMENT_NODE)) {
    iVar1 = xmlStrEqual(namespaceURI,(xmlChar *)"http://www.w3.org/2000/xmlns/");
    if (iVar1 == 0) {
      pxVar3 = xmlGetNsProp(reader->node,localName,namespaceURI);
      return pxVar3;
    }
    iVar1 = xmlStrEqual(localName,"xmlns");
    for (pxVar4 = reader->node->nsDef; pxVar4 != (xmlNs *)0x0; pxVar4 = pxVar4->next) {
      if ((iVar1 != 0) && (pxVar4->prefix == (xmlChar *)0x0)) {
LAB_001a35d1:
        pxVar3 = xmlStrdup(pxVar4->href);
        return pxVar3;
      }
      if (pxVar4->prefix != (xmlChar *)0x0) {
        iVar2 = xmlStrEqual(pxVar4->prefix,localName);
        if (iVar2 != 0) goto LAB_001a35d1;
      }
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlTextReaderGetAttributeNs(xmlTextReaderPtr reader, const xmlChar *localName,
			    const xmlChar *namespaceURI) {
    xmlChar *prefix = NULL;
    xmlNsPtr ns;

    if ((reader == NULL) || (localName == NULL))
	return(NULL);
    if (reader->node == NULL)
	return(NULL);
    if (reader->curnode != NULL)
	return(NULL);

    /* TODO: handle the xmlDecl */
    if (reader->node->type != XML_ELEMENT_NODE)
	return(NULL);

    if (xmlStrEqual(namespaceURI, BAD_CAST "http://www.w3.org/2000/xmlns/")) {
		if (! xmlStrEqual(localName, BAD_CAST "xmlns")) {
			prefix = BAD_CAST localName;
		}
		ns = reader->node->nsDef;
		while (ns != NULL) {
			if ((prefix == NULL && ns->prefix == NULL) ||
				((ns->prefix != NULL) && (xmlStrEqual(ns->prefix, localName)))) {
				return xmlStrdup(ns->href);
			}
			ns = ns->next;
		}
		return NULL;
    }

    return(xmlGetNsProp(reader->node, localName, namespaceURI));
}